

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinLock.cpp
# Opt level: O3

void __thiscall Threading::SpinLock::Wait(SpinLock *this)

{
  long lVar1;
  
  lVar1 = 0x40;
  do {
    if (((this->m_IsLocked)._M_base._M_i & 1U) == 0) {
      return;
    }
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  sched_yield();
  return;
}

Assistant:

void SpinLock::Wait() noexcept
{
    // Wait for the lock to be released without generating cache misses.
    constexpr size_t NumAttemptsToYield = 64;
    for (size_t Attempt = 0; Attempt < NumAttemptsToYield; ++Attempt)
    {
        if (!is_locked())
            return;

        // Issue X86 PAUSE or ARM YIELD instruction to reduce contention
        // between hyper-threads.
        PAUSE();
    }

    std::this_thread::yield();
}